

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::ProfileHandlerTest_RegisterCallbackBeforeThread_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::ProfileHandlerTest_RegisterCallbackBeforeThread_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)anon_unknown.dwarf_39d8::do_allocate(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__Test_00151f48;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }